

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void call(ch_context *context,ch_function *function,ch_argcount argcount)

{
  uint uVar1;
  uint8_t *puVar2;
  ch_call *pcVar3;
  ch_call *call;
  uint8_t *function_ptr;
  ch_argcount argcount_local;
  ch_function *function_local;
  ch_context *context_local;
  
  if ((context->call_stack).size < 0x100) {
    if (argcount == function->argcount) {
      puVar2 = context->pstart + context->data_size + (ulong)function->ptr;
      if ((puVar2 < context->pstart) || (context->pend <= puVar2)) {
        ch_runtime_error(context,EXIT_INVALID_INSTRUCTION_POINTER,
                         "Function pointer exceeds bounds of program.");
      }
      else {
        uVar1 = (context->call_stack).size;
        (context->call_stack).size = uVar1 + 1;
        pcVar3 = (context->call_stack).calls + uVar1;
        pcVar3->return_addr = context->pcurrent;
        pcVar3->stack_addr = (int)(context->stack).size - (uint)function->argcount;
        pcVar3->closure = (ch_closure *)0x0;
        context->pcurrent = puVar2;
      }
    }
    else {
      ch_runtime_error(context,EXIT_NOT_ENOUGH_ARGS_IN_STACK,
                       "Incorrect number of arguments passed to function (expected %u, got %u).",
                       (ulong)function->argcount,(ulong)argcount);
    }
  }
  else {
    ch_runtime_error(context,EXIT_STACK_SIZE_EXCEEDED,"Stack limit reached.");
  }
  return;
}

Assistant:

static void call(ch_context *context, ch_function *function,
                 ch_argcount argcount) {
  if (context->call_stack.size >= CH_CALL_STACK_SIZE) {
    ch_runtime_error(context, EXIT_STACK_SIZE_EXCEEDED, "Stack limit reached.");
    return;
  }

  if (argcount != function->argcount) {
    ch_runtime_error(
        context, EXIT_NOT_ENOUGH_ARGS_IN_STACK,
        "Incorrect number of arguments passed to function (expected %" PRIu8
        ", got %" PRIu8 ").",
        function->argcount, argcount);
    return;
  }

  uint8_t *function_ptr = context->pstart + function->ptr + context->data_size;
  if (!IS_PROGRAM_PTR_SAFE(context, function_ptr)) {
    ch_runtime_error(context, EXIT_INVALID_INSTRUCTION_POINTER,
                     "Function pointer exceeds bounds of program.");
    return;
  }

  ch_call *call = &context->call_stack.calls[context->call_stack.size++];
  call->return_addr = context->pcurrent;
  call->stack_addr = CH_STACK_ADDR(&context->stack) - function->argcount;
  call->closure = NULL;

  context->pcurrent = function_ptr;
}